

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QColorPicker::resizeEvent(QColorPicker *this,QResizeEvent *ev)

{
  undefined4 *puVar1;
  QWidgetData *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  QPoint local_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined4 local_50;
  undefined2 local_4c;
  undefined6 local_4a;
  undefined2 uStack_44;
  undefined2 uStack_42;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::resizeEvent((QWidget *)this,ev);
  pQVar2 = (this->super_QFrame).super_QWidget.data;
  iVar8 = (pQVar2->crect).x1.m_i;
  iVar9 = (pQVar2->crect).x2.m_i;
  iVar3 = QFrame::frameWidth(&this->super_QFrame);
  iVar10 = (iVar9 - (iVar8 + iVar3 * 2)) + 1;
  pQVar2 = (this->super_QFrame).super_QWidget.data;
  iVar8 = (pQVar2->crect).y1.m_i;
  iVar9 = (pQVar2->crect).y2.m_i;
  iVar3 = QFrame::frameWidth(&this->super_QFrame);
  iVar8 = (iVar9 - (iVar8 + iVar3 * 2)) + 1;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_68,iVar10,iVar8,Format_RGB32);
  iVar9 = 0;
  puVar7 = (undefined4 *)QImage::scanLine((int)(QImage *)&local_68);
  if (iVar8 < 1) {
    iVar8 = iVar9;
  }
  for (; iVar9 != iVar8; iVar9 = iVar9 + 1) {
    puVar1 = puVar7 + iVar10;
    iVar3 = 0;
    for (; puVar7 < puVar1; puVar7 = puVar7 + 1) {
      uStack_42 = 0xaaaa;
      local_50 = 0;
      local_4c = 0xffff;
      local_4a = 0;
      uStack_44 = 0;
      local_70.xp.m_i = iVar3;
      local_70.yp.m_i = iVar9;
      iVar4 = huePt(this,&local_70);
      iVar5 = satPt(this,&local_70);
      QColor::setHsv((int)&local_50,iVar4,iVar5,200);
      uVar6 = QColor::rgb();
      *puVar7 = uVar6;
      iVar3 = iVar3 + 1;
    }
  }
  QPixmap::fromImage((QPixmap *)&local_50,(QImage *)&local_68,0);
  QPixmap::operator=(&this->pix,(QPixmap *)&local_50);
  QPixmap::~QPixmap((QPixmap *)&local_50);
  QImage::~QImage((QImage *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorPicker::resizeEvent(QResizeEvent *ev)
{
    QFrame::resizeEvent(ev);

    int w = width() - frameWidth() * 2;
    int h = height() - frameWidth() * 2;
    QImage img(w, h, QImage::Format_RGB32);
    int x, y;
    uint *pixel = (uint *) img.scanLine(0);
    for (y = 0; y < h; y++) {
        const uint *end = pixel + w;
        x = 0;
        while (pixel < end) {
            QPoint p(x, y);
            QColor c;
            c.setHsv(huePt(p), satPt(p), 200);
            *pixel = c.rgb();
            ++pixel;
            ++x;
        }
    }
    pix = QPixmap::fromImage(img);
}